

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::Promise<void>_> __thiscall
kj::anon_unknown_36::WebSocketImpl::tryPumpFrom(WebSocketImpl *this,WebSocket *other)

{
  bool bVar1;
  byte bVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 extraout_RDX;
  Maybe<kj::Promise<void>_> MVar3;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  if ((*(undefined ***)in_RDX == &PTR_send_00591088) &&
     ((((Maybe<kj::EntropySource_&> *)((long)in_RDX + 0x20))->ptr == (EntropySource *)0x0) !=
      (other[4]._vptr_WebSocket == (_func_int **)0x0))) {
    bVar1 = (((Maybe<kj::CompressionParameters> *)((long)in_RDX + 0x28))->ptr).isSet;
    if (*(char *)&other[5]._vptr_WebSocket == '\x01') {
      if (bVar1 != false) {
        if (*(char *)&other[7]._vptr_WebSocket == '\0') {
          if (*(char *)((long)in_RDX + 0x48) == '\0') goto LAB_00314e53;
        }
        else if ((*(char *)((long)in_RDX + 0x48) != '\0') &&
                (other[8]._vptr_WebSocket == *(_func_int ***)((long)in_RDX + 0x50))) {
LAB_00314e53:
          if (*(char *)&other[9]._vptr_WebSocket == '\0') {
            if (*(char *)((long)in_RDX + 0x38) == '\0') goto LAB_00314e70;
          }
          else if ((*(char *)((long)in_RDX + 0x38) != '\0') &&
                  (other[10]._vptr_WebSocket == *(_func_int ***)((long)in_RDX + 0x40))) {
LAB_00314e70:
            if (((bool)*(char *)((long)&other[6]._vptr_WebSocket + 1) ==
                 (((anon_union_40_1_a8c68091_for_NullableValue<kj::CompressionParameters>_2 *)
                  ((long)in_RDX + 0x30))->value).outboundNoContextTakeover) &&
               (*(char *)&other[6]._vptr_WebSocket == *(char *)((long)in_RDX + 0x31)))
            goto LAB_00314e80;
          }
        }
      }
    }
    else if (bVar1 == false) {
LAB_00314e80:
      bVar2 = *(byte *)((long)&other[0x2c]._vptr_WebSocket + 1);
      _kjCondition.value = (bool)(bVar2 ^ 1);
      if (bVar2 != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[40]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xba6,FAILED,"!disconnected",
                   "_kjCondition,\"WebSocket can\'t send after disconnect()\"",&_kjCondition,
                   (char (*) [40])"WebSocket can\'t send after disconnect()");
        kj::_::Debug::Fault::fatal(&f);
      }
      bVar2 = *(byte *)((long)&other[0x2c]._vptr_WebSocket + 2);
      _kjCondition.value = (bool)(bVar2 ^ 1);
      if (bVar2 != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[44]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xba7,FAILED,"!currentlySending",
                   "_kjCondition,\"another message send is already in progress\"",&_kjCondition,
                   (char (*) [44])"another message send is already in progress");
        kj::_::Debug::Fault::fatal(&f);
      }
      *(undefined1 *)((long)&other[0x2c]._vptr_WebSocket + 2) = 1;
      *(undefined1 *)&other[0x2c]._vptr_WebSocket = 1;
      optimizedPumpTo((WebSocketImpl *)&f,(WebSocketImpl *)in_RDX);
      *(undefined1 *)&(this->super_WebSocket)._vptr_WebSocket = 1;
      (this->super_WebSocketErrorHandler)._vptr_WebSocketErrorHandler = (_func_int **)f.exception;
      f.exception = (Exception *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
      in_RDX = extraout_RDX;
      goto LAB_00314e43;
    }
  }
  *(undefined1 *)&(this->super_WebSocket)._vptr_WebSocket = 0;
LAB_00314e43:
  MVar3.ptr.field_1 = in_RDX;
  MVar3.ptr._0_8_ = this;
  return (Maybe<kj::Promise<void>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Promise<void>> tryPumpFrom(WebSocket& other) override {
    KJ_IF_SOME(optOther, kj::dynamicDowncastIfAvailable<WebSocketImpl>(other)) {
      // Both WebSockets are raw WebSockets, so we can pump the streams directly rather than read
      // whole messages.

      if ((maskKeyGenerator == kj::none) == (optOther.maskKeyGenerator == kj::none)) {
        // Oops, it appears that we either believe we are the client side of both sockets, or we
        // are the server side of both sockets. Since clients must "mask" their outgoing frames but
        // servers must *not* do so, we can't direct-pump. Sad.
        return kj::none;
      }

      KJ_IF_SOME(config, compressionConfig) {
        KJ_IF_SOME(otherConfig, optOther.compressionConfig) {
          if (config.outboundMaxWindowBits != otherConfig.inboundMaxWindowBits ||
              config.inboundMaxWindowBits != otherConfig.outboundMaxWindowBits ||
              config.inboundNoContextTakeover!= otherConfig.outboundNoContextTakeover ||
              config.outboundNoContextTakeover!= otherConfig.inboundNoContextTakeover) {
            // Compression configurations differ.
            return kj::none;
          }
        } else {
          // Only one websocket uses compression.
          return kj::none;
        }
      } else {
        if (optOther.compressionConfig != kj::none) {
          // Only one websocket uses compression.
          return kj::none;
        }
      }
      // Both websockets use compatible compression configurations so we can pump directly.

      // Check same error conditions as with sendImpl().
      KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
      KJ_REQUIRE(!currentlySending, "another message send is already in progress");
      currentlySending = true;

      // If the application chooses to pump messages out, but receives incoming messages normally
      // with `receive()`, then we will receive pings and attempt to send pongs. But we can't
      // safely insert a pong in the middle of a pumped stream. We kind of don't have a choice
      // except to drop them on the floor, which is what will happen if we set `hasSentClose` true.
      // Hopefully most apps that set up a pump do so in both directions at once, and so pings will
      // flow through and pongs will flow back.
      hasSentClose = true;

      return optOther.optimizedPumpTo(*this);
    }